

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.hpp
# Opt level: O2

OStreamer * __thiscall LiteScript::OStreamer::operator<<(OStreamer *this,uint *v)

{
  Write<unsigned_int>(this->stream,*v);
  return this;
}

Assistant:

OStreamer& operator<<(const T& v) {
            Write<T>(this->stream, v);
            return *this;
        }